

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

void nghttp2_stream_dep_add(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  
  dep_stream->sum_dep_weight = dep_stream->sum_dep_weight + stream->weight;
  if (dep_stream->dep_next == (nghttp2_stream *)0x0) {
    dep_stream->dep_next = stream;
    stream->dep_prev = dep_stream;
    return;
  }
  if (stream->sib_prev == (nghttp2_stream *)0x0) {
    pnVar1 = dep_stream->dep_next;
    stream->sib_next = pnVar1;
    if (pnVar1 != (nghttp2_stream *)0x0) {
      pnVar1->sib_prev = stream;
    }
    dep_stream->dep_next = stream;
    stream->dep_prev = dep_stream;
    return;
  }
  __assert_fail("stream->sib_prev == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0x29e,"void insert_link_dep(nghttp2_stream *, nghttp2_stream *)");
}

Assistant:

void nghttp2_stream_dep_add(nghttp2_stream *dep_stream,
                            nghttp2_stream *stream) {
  DEBUGF("stream: dep_add dep_stream(%p)=%d, stream(%p)=%d\n", dep_stream,
         dep_stream->stream_id, stream, stream->stream_id);

  dep_stream->sum_dep_weight += stream->weight;

  if (dep_stream->dep_next == NULL) {
    link_dep(dep_stream, stream);
  } else {
    insert_link_dep(dep_stream, stream);
  }

  validate_tree(stream);
}